

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::TestSpecParser::visitChar(TestSpecParser *this,char c)

{
  Mode MVar1;
  char cVar2;
  bool bVar3;
  
  MVar1 = this->m_mode;
  cVar2 = (char)this;
  if (c == '\\' && MVar1 != EscapedName) {
    escape(this);
  }
  else {
    if (c == ',' && MVar1 != EscapedName) {
      bVar3 = separate(this);
      return bVar3;
    }
    if (MVar1 != EscapedName) {
      if (MVar1 == Name) {
        processNameChar(this,c);
      }
      else if (MVar1 == None) {
        if (c < '[') {
          if (c == ' ') {
            return true;
          }
          if (c == '\"') {
            this->m_mode = QuotedName;
          }
          else {
LAB_00138a66:
            this->m_mode = Name;
          }
        }
        else if (c == '[') {
          this->m_mode = Tag;
        }
        else {
          if (c != '~') goto LAB_00138a66;
          this->m_exclusion = true;
        }
      }
      else {
        bVar3 = processOtherChar(this,c);
        if (bVar3) {
          return true;
        }
      }
      std::__cxx11::string::push_back(cVar2 + '@');
      switch(this->m_mode) {
      case None:
        bVar3 = c == '~';
        break;
      case Name:
        bVar3 = c == '[';
        break;
      case QuotedName:
        bVar3 = c == '\"';
        break;
      case Tag:
        bVar3 = (c + 0xa5U & 0xfd) == 0;
        break;
      case EscapedName:
        return true;
      default:
        goto switchD_00138a99_default;
      }
      if (bVar3) {
        return true;
      }
      goto switchD_00138a99_default;
    }
    endMode(this);
  }
  std::__cxx11::string::push_back(cVar2 + '@');
switchD_00138a99_default:
  std::__cxx11::string::push_back(cVar2 + '`');
  this->m_realPatternPos = this->m_realPatternPos + 1;
  return true;
}

Assistant:

bool TestSpecParser::visitChar( char c ) {
        if( (m_mode != EscapedName) && (c == '\\') ) {
            escape();
            addCharToPattern(c);
            return true;
        }else if((m_mode != EscapedName) && (c == ',') )  {
            return separate();
        }

        switch( m_mode ) {
        case None:
            if( processNoneChar( c ) )
                return true;
            break;
        case Name:
            processNameChar( c );
            break;
        case EscapedName:
            endMode();
            addCharToPattern(c);
            return true;
        default:
        case Tag:
        case QuotedName:
            if( processOtherChar( c ) )
                return true;
            break;
        }

        m_substring += c;
        if( !isControlChar( c ) ) {
            m_patternName += c;
            m_realPatternPos++;
        }
        return true;
    }